

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.c
# Opt level: O1

void re_concat_onto(re_context *ctx,re_machine *dest,re_machine *rhs)

{
  re_tuple *prVar1;
  re_state_id rVar2;
  re_state_id rVar3;
  re_state_id rVar4;
  re_machine rVar5;
  
  if (dest->init == -1) {
    rVar5 = *rhs;
  }
  else {
    rVar3 = re_alloc_state(ctx);
    rVar4 = re_alloc_state(ctx);
    rVar2 = dest->init;
    prVar1 = ctx->tuple_arr + rVar3;
    if (ctx->tuple_arr[rVar3].next_state_1 == -1) {
      if ((prVar1->flags & 6) == 0) {
        prVar1->ch = '\x01';
      }
      prVar1->next_state_1 = rVar2;
    }
    else {
      prVar1->next_state_2 = rVar2;
    }
    rVar2 = rhs->init;
    prVar1 = ctx->tuple_arr + dest->final;
    if (ctx->tuple_arr[dest->final].next_state_1 == -1) {
      if ((prVar1->flags & 6) == 0) {
        prVar1->ch = '\x01';
      }
      prVar1->next_state_1 = rVar2;
    }
    else {
      prVar1->next_state_2 = rVar2;
    }
    prVar1 = ctx->tuple_arr + rhs->final;
    if (ctx->tuple_arr[rhs->final].next_state_1 == -1) {
      if ((prVar1->flags & 6) == 0) {
        prVar1->ch = '\x01';
      }
      prVar1->next_state_1 = rVar4;
    }
    else {
      prVar1->next_state_2 = rVar4;
    }
    rVar5.final = rVar4;
    rVar5.init = rVar3;
  }
  *dest = rVar5;
  return;
}

Assistant:

static void re_concat_onto(re_context *ctx,
                           re_machine *dest, re_machine *rhs)
{
    /* check for a null destination machine */
    if (re_is_machine_null(ctx, dest))
    {
        /* 
         *   the first machine is null - simply copy the second machine
         *   onto the first unchanged 
         */
        *dest = *rhs;
    }
    else
    {
        re_machine new_machine;
        
        /* build the concatenated machine */
        re_build_concat(ctx, &new_machine, dest, rhs);

        /* copy the concatenated machine onto the first machine */
        *dest = new_machine;
    }
}